

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void loadVEXData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
                QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
                QMultiHash<char,_QLatin1String> *other)

{
  QMultiHash<char,_QLatin1String> *other_local;
  QMultiHash<char,_QLatin1String> *literals_local;
  QMultiHash<char,_QLatin1String> *builtin_local;
  QMultiHash<char,_QLatin1String> *keywords_local;
  QMultiHash<char,_QLatin1String> *types_local;
  
  if (!vexDataInitialized) {
    initVEXData();
    vexDataInitialized = true;
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&vex_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&vex_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&vex_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&vex_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&vex_other);
  return;
}

Assistant:

void loadVEXData(QMultiHash<char, QLatin1String> &types,
                 QMultiHash<char, QLatin1String> &keywords,
                 QMultiHash<char, QLatin1String> &builtin,
                 QMultiHash<char, QLatin1String> &literals,
                 QMultiHash<char, QLatin1String> &other) {
    if (!vexDataInitialized) {
        initVEXData();
        vexDataInitialized = true;
    }
    types = vex_types;
    keywords = vex_keywords;
    builtin = vex_builtin;
    literals = vex_literals;
    other = vex_other;
}